

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O2

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureDestroyCommand>
          (CCommandBuffer *this,CTextureDestroyCommand *Command)

{
  CCommand *pCVar1;
  undefined4 uVar2;
  CCommand *pCVar3;
  
  pCVar3 = (CCommand *)CBuffer::Alloc(&this->m_CmdBuffer,0x18,8);
  if (pCVar3 != (CCommand *)0x0) {
    uVar2 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
    pCVar1 = (Command->super_CCommand).m_pNext;
    pCVar3->m_Cmd = (Command->super_CCommand).m_Cmd;
    *(undefined4 *)&pCVar3->field_0x4 = uVar2;
    pCVar3->m_pNext = pCVar1;
    pCVar3[1].m_Cmd = Command->m_Slot;
    pCVar3->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar3;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar3;
    }
    this->m_pCmdBufferTail = pCVar3;
  }
  return pCVar3 != (CCommand *)0x0;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}